

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::setUniform
          (SeparateShaderTest *this,ProgramWrapper *program,string *uniformName,GLfloat value,
          bool useProgramUniform)

{
  GLuint program_00;
  GLchar *name;
  TestLog *this_00;
  MessageBuilder *pMVar1;
  double __x;
  undefined1 local_1b0 [8];
  MessageBuilder msg;
  GLint location;
  GLuint progName;
  bool useProgramUniform_local;
  string *psStack_20;
  GLfloat value_local;
  string *uniformName_local;
  ProgramWrapper *program_local;
  SeparateShaderTest *this_local;
  
  progName = (GLuint)value;
  psStack_20 = uniformName;
  uniformName_local = (string *)program;
  program_local = (ProgramWrapper *)this;
  program_00 = (*program->_vptr_ProgramWrapper[2])();
  msg._380_4_ = program_00;
  name = (GLchar *)std::__cxx11::string::c_str();
  msg._376_4_ = glu::CallLogWrapper::glGetUniformLocation
                          (&this->super_CallLogWrapper,program_00,name);
  log(this,__x);
  tcu::TestLog::message((MessageBuilder *)local_1b0,this_00);
  pMVar1 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b0,(char (*) [16])"// Set program ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)&msg.field_0x17c);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [13])"\'s uniform \'");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,psStack_20);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [6])0xf2bd2a);
  tcu::MessageBuilder::operator<<(pMVar1,(float *)&progName);
  if (useProgramUniform) {
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(char (*) [26])" using glProgramUniform1f");
    glu::CallLogWrapper::glProgramUniform1f
              (&this->super_CallLogWrapper,msg._380_4_,msg._376_4_,(GLfloat)progName);
  }
  else {
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(char (*) [36])" using glUseProgram and glUniform1f");
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,msg._380_4_);
    glu::CallLogWrapper::glUniform1f(&this->super_CallLogWrapper,msg._376_4_,(GLfloat)progName);
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,0);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1b0);
  return;
}

Assistant:

void SeparateShaderTest::setUniform (ProgramWrapper&	program,
									 const string&		uniformName,
									 GLfloat			value,
									 bool				useProgramUniform)
{
	const GLuint		progName	= program.getProgramName();
	const GLint			location	= glGetUniformLocation(progName, uniformName.c_str());
	MessageBuilder		msg			= log().message();

	msg << "// Set program " << progName << "'s uniform '" << uniformName << "' to " << value;
	if (useProgramUniform)
	{
		msg << " using glProgramUniform1f";
		glProgramUniform1f(progName, location, value);
	}
	else
	{
		msg << " using glUseProgram and glUniform1f";
		glUseProgram(progName);
		glUniform1f(location, value);
		glUseProgram(0);
	}
	msg << TestLog::EndMessage;
}